

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

Frustum<float> * __thiscall
Imath_3_2::Frustum<float>::operator=(Frustum<float> *this,Frustum<float> *f)

{
  Frustum<float> *f_local;
  Frustum<float> *this_local;
  
  this->_nearPlane = f->_nearPlane;
  this->_farPlane = f->_farPlane;
  this->_left = f->_left;
  this->_right = f->_right;
  this->_top = f->_top;
  this->_bottom = f->_bottom;
  this->_orthographic = (bool)(f->_orthographic & 1);
  return this;
}

Assistant:

IMATH_CONSTEXPR14 inline const Frustum<T>&
Frustum<T>::operator= (const Frustum& f) IMATH_NOEXCEPT
{
    _nearPlane    = f._nearPlane;
    _farPlane     = f._farPlane;
    _left         = f._left;
    _right        = f._right;
    _top          = f._top;
    _bottom       = f._bottom;
    _orthographic = f._orthographic;

    return *this;
}